

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetRootValueForTypeOf<true,Js::PolymorphicInlineCache>
              (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,DynamicObject *object,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var errorObject_00;
  JavascriptLibrary *this;
  Var errorObject;
  JavascriptException *err;
  AutoCleanup local_b8;
  AutoCleanup autoCleanup;
  undefined1 local_a0 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  JavascriptExceptionObject *exceptionObject;
  Var value;
  PropertyValueInfo info;
  ScriptContext *scriptContext;
  PropertyId propertyId_local;
  DynamicObject *object_local;
  InlineCacheIndex inlineCacheIndex_local;
  PolymorphicInlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  bVar2 = VarIs<Js::RootObjectBase,Js::DynamicObject>(object);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1fbb,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  info._56_8_ = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)&value,functionBody,inlineCache,inlineCacheIndex,false);
  exceptionObject = (JavascriptExceptionObject *)0x0;
  bVar2 = CacheOperators::TryGetProperty<true,true,true,false,true,false,false,true,false,false>
                    (object,true,&object->super_RecyclableObject,propertyId,&exceptionObject,
                     (ScriptContext *)info._56_8_,(PropertyCacheOperationInfo *)0x0,
                     (PropertyValueInfo *)&value);
  if (bVar2) {
    functionBody_local = (FunctionBody *)exceptionObject;
  }
  else {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
    if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetRootValueForTypeOf",propertyId,(ScriptContext *)info._56_8_,
                 &object->super_RecyclableObject);
    }
    exceptionObject = (JavascriptExceptionObject *)0x0;
    autoCatchHandlerExists.m_threadContext = (ThreadContext *)0x0;
    JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)local_a0,(ScriptContext *)info._56_8_,true);
    PatchGetRootValueForTypeOf<true,Js::PolymorphicInlineCache>(Js::FunctionBody*,Js::
    PolymorphicInlineCache*,unsigned_int,Js::DynamicObject*,int)::AutoCleanup::AutoCleanup(Js::
    ScriptContext__(&local_b8,(ScriptContext *)info._56_8_);
    bVar2 = VarIsCorrectType<Js::RecyclableObject>(&object->super_RecyclableObject);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1fd0,
                                  "(VarIsCorrectType(static_cast<RecyclableObject*>(object)))",
                                  "VarIsCorrectType(static_cast<RecyclableObject*>(object))");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BVar3 = GetRootProperty(object,propertyId,&exceptionObject,(ScriptContext *)info._56_8_,
                            (PropertyValueInfo *)&value);
    if (BVar3 == 0) {
      bVar2 = false;
    }
    else {
      bVar2 = ScriptContext::IsUndeclBlockVar((ScriptContext *)info._56_8_,exceptionObject);
      if (bVar2) {
        JavascriptError::ThrowReferenceError((ScriptContext *)info._56_8_,-0x7ff5ec07,(PCWSTR)0x0);
      }
      functionBody_local = (FunctionBody *)exceptionObject;
      bVar2 = true;
    }
    PatchGetRootValueForTypeOf<true,_Js::PolymorphicInlineCache>::AutoCleanup::~AutoCleanup
              (&local_b8);
    JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)local_a0);
    if (!bVar2) {
      if (autoCatchHandlerExists.m_threadContext != (ThreadContext *)0x0) {
        errorObject_00 =
             JavascriptExceptionObject::GetThrownObject
                       ((JavascriptExceptionObject *)autoCatchHandlerExists.m_threadContext,
                        (ScriptContext *)0x0);
        bVar2 = JavascriptError::ShouldTypeofErrorBeReThrown(errorObject_00);
        if (bVar2) {
          bVar2 = ScriptContext::IsScriptContextInDebugMode((ScriptContext *)info._56_8_);
          if (bVar2) {
            JavascriptExceptionOperators::ThrowExceptionObject
                      ((JavascriptExceptionObject *)autoCatchHandlerExists.m_threadContext,
                       (ScriptContext *)info._56_8_,true,(PVOID)0x0,false);
          }
          JavascriptExceptionOperators::DoThrowCheckClone
                    ((JavascriptExceptionObject *)autoCatchHandlerExists.m_threadContext,
                     (ScriptContext *)info._56_8_);
        }
      }
      bVar2 = ScriptContext::IsUndeclBlockVar((ScriptContext *)info._56_8_,exceptionObject);
      if (bVar2) {
        JavascriptError::ThrowReferenceError((ScriptContext *)info._56_8_,-0x7ff5ec07,(PCWSTR)0x0);
      }
      this = ScriptContext::GetLibrary((ScriptContext *)info._56_8_);
      functionBody_local =
           (FunctionBody *)JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
    }
  }
  return functionBody_local;
}

Assistant:

Var JavascriptOperators::PatchGetRootValueForTypeOf(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject * object, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetRootValueForTypeOf);
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value = nullptr;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
            object, true, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetRootValueForTypeOf"), propertyId, scriptContext, object);
        }
#endif
        value = nullptr;
        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        AssertOrFailFast(VarIsCorrectType(static_cast<RecyclableObject*>(object)));
        if (JavascriptOperators::GetRootProperty(object, propertyId, &value, scriptContext, &info))
        {
            if (scriptContext->IsUndeclBlockVar(value))
            {
                JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
            }
            return value;
        }
        END_TYPEOF_ERROR_HANDLER(scriptContext, value);

        value = scriptContext->GetLibrary()->GetUndefined();
        return value;
        JIT_HELPER_END(Op_PatchGetRootValueForTypeOf);
    }